

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::audit_feature(audit_results *dat,float ft_weight,uint64_t ft_idx)

{
  sparse_parameters *psVar1;
  float fVar2;
  vw *pvVar3;
  pointer pbVar4;
  _func_void_weight_ptr_void_ptr *p_Var5;
  shared_data *psVar6;
  uint64_t *puVar7;
  ostream *poVar8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var9;
  weight *pwVar10;
  float *pfVar11;
  long *plVar12;
  const_iterator cVar13;
  undefined1 **ppuVar14;
  ulong uVar15;
  uint32_t *puVar16;
  vw *pvVar17;
  string *s;
  pointer pbVar18;
  float fVar19;
  float fVar20;
  string_value sv;
  string ns_pre;
  uint64_t index_2;
  uint64_t index;
  ostringstream tempstream;
  undefined1 local_220 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  ulong local_1f8;
  key_type local_1f0;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  float *local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  ulong local_188;
  ios_base local_138 [264];
  
  pvVar3 = dat->all;
  puVar16 = &(pvVar3->weights).dense_weights._stride_shift;
  puVar7 = &(pvVar3->weights).dense_weights._weight_mask;
  if ((pvVar3->weights).sparse != false) {
    puVar16 = &(pvVar3->weights).sparse_weights._stride_shift;
    puVar7 = &(pvVar3->weights).sparse_weights._weight_mask;
  }
  uVar15 = ft_idx & *puVar7;
  local_1f8 = (ulong)*puVar16;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  pbVar18 = (dat->ns_pre).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (dat->ns_pre).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar17 = pvVar3;
  if (pbVar18 != pbVar4) {
    do {
      std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)(pbVar18->_M_dataplus)._M_p);
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != pbVar4);
    pvVar17 = dat->all;
  }
  if (pvVar17->audit != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_220[0] = 0x3a;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_220,1);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    local_220[0] = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_220,1);
    poVar8 = std::ostream::_M_insert<double>((double)ft_weight);
    local_220[0] = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_220,1);
    if ((pvVar3->weights).sparse == true) {
      psVar1 = &(pvVar3->weights).sparse_weights;
      local_1c8 = (undefined1 *)((pvVar3->weights).sparse_weights._weight_mask & uVar15);
      _Var9._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)psVar1,(key_type_conflict *)&local_1c8);
      if (_Var9._M_cur == (__node_type *)0x0) {
        local_220._8_8_ =
             calloc_or_throw<float>
                       (1L << ((byte)(pvVar3->weights).sparse_weights._stride_shift & 0x3f));
        local_220._0_8_ = local_1c8;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)psVar1);
        _Var9._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,(key_type_conflict *)&local_1c8);
        p_Var5 = (pvVar3->weights).sparse_weights.fun;
        if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*p_Var5)(*(weight **)((long)_Var9._M_cur + 0x10),
                    (pvVar3->weights).sparse_weights.default_data);
        }
      }
      pfVar11 = *(float **)
                 ((long)&((_Var9._M_cur)->
                         super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                         super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                         _M_storage._M_storage + 8);
    }
    else {
      pfVar11 = (pvVar3->weights).dense_weights._begin +
                ((pvVar3->weights).dense_weights._weight_mask & uVar15);
    }
    fVar2 = *pfVar11;
    psVar6 = dat->all->sd;
    fVar19 = (float)psVar6->gravity;
    fVar20 = 0.0;
    if (fVar19 < ABS(fVar2)) {
      fVar20 = fVar19 * *(float *)(&DAT_00291fc8 + (ulong)(fVar2 < 0.0) * 4) + fVar2;
    }
    std::ostream::_M_insert<double>((double)((float)psVar6->contraction * fVar20));
    if (dat->all->adaptive == true) {
      local_220[0] = 0x40;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_220,1);
      if ((pvVar3->weights).sparse == true) {
        psVar1 = &(pvVar3->weights).sparse_weights;
        local_1c8 = (undefined1 *)((pvVar3->weights).sparse_weights._weight_mask & uVar15);
        _Var9._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,(key_type_conflict *)&local_1c8);
        if (_Var9._M_cur == (__node_type *)0x0) {
          local_220._8_8_ =
               calloc_or_throw<float>
                         (1L << ((byte)(pvVar3->weights).sparse_weights._stride_shift & 0x3f));
          local_220._0_8_ = local_1c8;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)psVar1);
          _Var9._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,(key_type_conflict *)&local_1c8);
          p_Var5 = (pvVar3->weights).sparse_weights.fun;
          if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var5)(*(weight **)((long)_Var9._M_cur + 0x10),
                      (pvVar3->weights).sparse_weights.default_data);
          }
        }
        pwVar10 = *(weight **)
                   ((long)&((_Var9._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                           _M_storage._M_storage + 8);
      }
      else {
        pwVar10 = (pvVar3->weights).dense_weights._begin +
                  ((pvVar3->weights).dense_weights._weight_mask & uVar15);
      }
      std::ostream::_M_insert<double>((double)pwVar10[1]);
    }
    if ((pvVar3->weights).sparse == true) {
      psVar1 = &(pvVar3->weights).sparse_weights;
      local_1d0 = (undefined1 *)((pvVar3->weights).sparse_weights._weight_mask & uVar15);
      _Var9._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)psVar1,(key_type_conflict *)&local_1d0);
      if (_Var9._M_cur == (__node_type *)0x0) {
        local_1c0 = calloc_or_throw<float>
                              (1L << ((byte)(pvVar3->weights).sparse_weights._stride_shift & 0x3f));
        local_1c8 = local_1d0;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)psVar1);
        _Var9._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,(key_type_conflict *)&local_1d0);
        p_Var5 = (pvVar3->weights).sparse_weights.fun;
        if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*p_Var5)(*(weight **)((long)_Var9._M_cur + 0x10),
                    (pvVar3->weights).sparse_weights.default_data);
        }
      }
      pfVar11 = *(float **)
                 ((long)&((_Var9._M_cur)->
                         super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                         super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                         _M_storage._M_storage + 8);
    }
    else {
      pfVar11 = (pvVar3->weights).dense_weights._begin +
                ((pvVar3->weights).dense_weights._weight_mask & uVar15);
    }
    local_220._0_4_ = ft_weight * *pfVar11;
    std::__cxx11::stringbuf::str();
    plVar12 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1f0._M_dataplus._M_p);
    ppuVar14 = (undefined1 **)(plVar12 + 2);
    if ((undefined1 **)*plVar12 == ppuVar14) {
      local_208._M_allocated_capacity = (size_type)*ppuVar14;
      local_208._8_8_ = plVar12[3];
      local_220._8_8_ = &local_208;
    }
    else {
      local_208._M_allocated_capacity = (size_type)*ppuVar14;
      local_220._8_8_ = (undefined1 **)*plVar12;
    }
    local_220._16_8_ = plVar12[1];
    *plVar12 = (long)ppuVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    std::vector<GD::string_value,_std::allocator<GD::string_value>_>::push_back
              (&dat->results,(value_type *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._8_8_ != &local_208) {
      operator_delete((void *)local_220._8_8_);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pvVar17 = dat->all;
  }
  if (((pvVar17->current_pass == 0) || (pvVar17->training == false)) && (pvVar17->hash_inv == true))
  {
    if (dat->offset != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      local_220[0] = 0x5b;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_220,1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      local_220[0] = 0x5d;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_220,1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_1f0,local_220._0_8_);
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pvVar17 = dat->all;
    }
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::find(&(pvVar17->name_index_map)._M_t,&local_1f0);
    if ((_Rb_tree_header *)cVar13._M_node ==
        &(pvVar17->name_index_map)._M_t._M_impl.super__Rb_tree_header) {
      pvVar3 = dat->all;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_1f0._M_dataplus._M_p,
                 local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
      local_188 = uVar15 >> ((byte)local_1f8 & 0x3f);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_long>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)&pvVar3->name_index_map,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void audit_feature(audit_results& dat, const float ft_weight, const uint64_t ft_idx)
{
  parameters& weights = dat.all.weights;
  uint64_t index = ft_idx & weights.mask();
  size_t stride_shift = weights.stride_shift();

  string ns_pre;
  for (string& s : dat.ns_pre) ns_pre += s;

  if (dat.all.audit)
  {
    ostringstream tempstream;
    tempstream << ':' << (index >> stride_shift) << ':' << ft_weight << ':'
               << trunc_weight(weights[index], (float)dat.all.sd->gravity) * (float)dat.all.sd->contraction;

    if (dat.all.adaptive)
      tempstream << '@' << (&weights[index])[1];

    string_value sv = {weights[index] * ft_weight, ns_pre + tempstream.str()};
    dat.results.push_back(sv);
  }

  if ((dat.all.current_pass == 0 || dat.all.training == false) && dat.all.hash_inv)
  {
    // for invert_hash

    if (dat.offset != 0)
    {
      // otherwise --oaa output no features for class > 0.
      ostringstream tempstream;
      tempstream << '[' << (dat.offset >> stride_shift) << ']';
      ns_pre += tempstream.str();
    }

    if (!dat.all.name_index_map.count(ns_pre))
      dat.all.name_index_map.insert(std::map<std::string, size_t>::value_type(ns_pre, index >> stride_shift));
  }
}